

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption_NamePart::~UninterpretedOption_NamePart
          (UninterpretedOption_NamePart *this)

{
  undefined8 *in_RDI;
  UninterpretedOption_NamePart *in_stack_00000050;
  
  *in_RDI = &PTR__UninterpretedOption_NamePart_0096aff0;
  SharedDtor(in_stack_00000050);
  internal::InternalMetadataWithArena::~InternalMetadataWithArena
            ((InternalMetadataWithArena *)0x533392);
  Message::~Message((Message *)0x53339c);
  return;
}

Assistant:

UninterpretedOption_NamePart::~UninterpretedOption_NamePart() {
  // @@protoc_insertion_point(destructor:google.protobuf.UninterpretedOption.NamePart)
  SharedDtor();
}